

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

int fp_enc_row_mt_worker_hook(void *arg1,void *unused)

{
  int *piVar1;
  BLOCK_SIZE BVar2;
  byte bVar3;
  _Bool _Var4;
  uint uVar5;
  int iVar6;
  AV1_COMP *cpi;
  pthread_mutex_t *__mutex;
  TileDataEnc *pTVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  TileDataEnc *pTVar23;
  TileDataEnc *tile;
  int iVar24;
  
  cpi = *arg1;
  iVar20 = *(int *)((long)arg1 + 0x1cc);
  __mutex = (cpi->mt_info).enc_row_mt.mutex_;
  *(long *)(*(long *)((long)arg1 + 8) + 0x2b90) = (long)arg1 + 0x18;
  iVar11 = _setjmp((__jmp_buf_tag *)((long)arg1 + 0xf0));
  if (iVar11 == 0) {
    *(undefined4 *)((long)arg1 + 0xe8) = 1;
    iVar20 = (cpi->mt_info).enc_row_mt.thread_id_to_tile_id[iVar20];
    BVar2 = cpi->fp_block_size;
    bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar2];
    bVar9 = false;
    while( true ) {
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      _Var4 = (cpi->mt_info).enc_row_mt.firstpass_mt_exit;
      iVar11 = -1;
      if (_Var4 == false) {
        pTVar7 = cpi->tile_data;
        iVar11 = pTVar7[iVar20].row_mt_sync.next_mi_row;
        if (iVar11 < pTVar7[iVar20].tile_info.mi_row_end) {
          piVar1 = &pTVar7[iVar20].row_mt_sync.num_threads_working;
          *piVar1 = *piVar1 + 1;
          pTVar7[iVar20].row_mt_sync.next_mi_row = (uint)bVar3 + iVar11;
        }
        else {
          lVar15 = (long)(cpi->common).tiles.rows;
          if (lVar15 < 1) {
            iVar21 = -1;
          }
          else {
            uVar5 = (cpi->common).tiles.cols;
            iVar22 = 0x7fffffff;
            iVar21 = -1;
            iVar17 = 0;
            lVar19 = 0;
            pTVar23 = pTVar7;
            iVar11 = iVar17;
            do {
              uVar18 = (ulong)uVar5;
              tile = pTVar23;
              iVar24 = iVar17;
              if (0 < (int)uVar5) {
                do {
                  iVar12 = av1_get_unit_rows_in_tile(&tile->tile_info,BVar2);
                  iVar13 = av1_get_unit_cols_in_tile(&tile->tile_info,BVar2);
                  iVar13 = iVar13 + 1 >> 1;
                  if (iVar12 <= iVar13) {
                    iVar13 = iVar12;
                  }
                  iVar12 = (tile->row_mt_sync).num_threads_working;
                  iVar10 = iVar21;
                  if ((iVar12 < iVar13) &&
                     (iVar13 = (tile->tile_info).mi_row_end, iVar6 = (tile->row_mt_sync).next_mi_row
                     , iVar14 = iVar13 - iVar6, iVar14 != 0 && iVar6 <= iVar13)) {
                    iVar13 = iVar22;
                    if (iVar12 < iVar22) {
                      iVar13 = iVar12;
                    }
                    iVar6 = iVar11;
                    if (iVar12 < iVar22) {
                      iVar6 = 0;
                    }
                    bVar8 = iVar22 < iVar12;
                    iVar11 = iVar14;
                    iVar10 = iVar24;
                    iVar22 = iVar13;
                    if (bVar8 || iVar14 <= iVar6) {
                      iVar11 = iVar6;
                      iVar10 = iVar21;
                    }
                  }
                  iVar21 = iVar10;
                  iVar24 = iVar24 + 1;
                  tile = tile + 1;
                  uVar18 = uVar18 - 1;
                } while (uVar18 != 0);
              }
              lVar19 = lVar19 + 1;
              iVar17 = iVar17 + uVar5;
              pTVar23 = pTVar23 + uVar5;
            } while (lVar19 != lVar15);
          }
          if (iVar21 == -1) {
            bVar9 = true;
            iVar11 = -1;
          }
          else {
            iVar11 = pTVar7[iVar21].row_mt_sync.next_mi_row;
            iVar20 = iVar21;
            if (iVar11 < pTVar7[iVar21].tile_info.mi_row_end) {
              piVar1 = &pTVar7[iVar21].row_mt_sync.num_threads_working;
              *piVar1 = *piVar1 + 1;
              pTVar7[iVar21].row_mt_sync.next_mi_row = (uint)bVar3 + iVar11;
            }
            else {
              iVar11 = -1;
            }
          }
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if ((_Var4 != false) || (bVar9)) break;
      pTVar7 = cpi->tile_data;
      av1_first_pass_row(cpi,*(ThreadData_conflict **)((long)arg1 + 8),pTVar7 + iVar20,
                         iVar11 >> (""[BVar2] & 0x1f),BVar2);
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      piVar1 = &pTVar7[iVar20].row_mt_sync.num_threads_working;
      *piVar1 = *piVar1 + -1;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    iVar20 = 1;
  }
  else {
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    (cpi->mt_info).enc_row_mt.firstpass_mt_exit = true;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    lVar15 = (long)(cpi->common).tiles.rows;
    if (0 < lVar15) {
      BVar2 = cpi->fp_block_size;
      bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar2];
      uVar5 = (cpi->common).tiles.cols;
      lVar19 = 0;
      do {
        if (0 < (int)uVar5) {
          lVar16 = lVar19 * (ulong)uVar5;
          uVar18 = 0;
          do {
            pTVar7 = cpi->tile_data;
            iVar11 = av1_get_unit_cols_in_tile(&pTVar7[uVar18 + lVar16].tile_info,BVar2);
            iVar20 = pTVar7[uVar18 + lVar16].tile_info.mi_row_start;
            if (iVar20 < pTVar7[uVar18 + lVar16].tile_info.mi_row_end) {
              iVar21 = 0;
              do {
                iVar20 = iVar20 + (uint)bVar3;
                (*(cpi->mt_info).enc_row_mt.sync_write_ptr)
                          (&pTVar7[uVar18 + lVar16].row_mt_sync,iVar21,iVar11 + -1,iVar11);
                iVar21 = iVar21 + 1;
              } while (iVar20 < pTVar7[uVar18 + lVar16].tile_info.mi_row_end);
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar5);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != lVar15);
    }
    iVar20 = 0;
  }
  return iVar20;
}

Assistant:

static int fp_enc_row_mt_worker_hook(void *arg1, void *unused) {
  EncWorkerData *const thread_data = (EncWorkerData *)arg1;
  AV1_COMP *const cpi = thread_data->cpi;
  int thread_id = thread_data->thread_id;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &cpi->mt_info.enc_row_mt;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *enc_row_mt_mutex_ = enc_row_mt->mutex_;
#endif
  (void)unused;
  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  MACROBLOCKD *const xd = &thread_data->td->mb.e_mbd;
  xd->error_info = error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
    enc_row_mt->firstpass_mt_exit = true;
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
    set_firstpass_encode_done(cpi);
    return 0;
  }
  error_info->setjmp = 1;

  AV1_COMMON *const cm = &cpi->common;
  int cur_tile_id = enc_row_mt->thread_id_to_tile_id[thread_id];
  assert(cur_tile_id != -1);

  const BLOCK_SIZE fp_block_size = cpi->fp_block_size;
  const int unit_height = mi_size_high[fp_block_size];
  int end_of_frame = 0;
  while (1) {
    int current_mi_row = -1;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
#endif
    bool firstpass_mt_exit = enc_row_mt->firstpass_mt_exit;
    if (!firstpass_mt_exit && !get_next_job(&cpi->tile_data[cur_tile_id],
                                            &current_mi_row, unit_height)) {
      // No jobs are available for the current tile. Query for the status of
      // other tiles and get the next job if available
      switch_tile_and_get_next_job(cm, cpi->tile_data, &cur_tile_id,
                                   &current_mi_row, &end_of_frame, 1,
                                   fp_block_size);
    }
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
    // When firstpass_mt_exit is set to true, other workers need not pursue any
    // further jobs.
    if (firstpass_mt_exit || end_of_frame) break;

    TileDataEnc *const this_tile = &cpi->tile_data[cur_tile_id];
    AV1EncRowMultiThreadSync *const row_mt_sync = &this_tile->row_mt_sync;
    ThreadData *td = thread_data->td;

    assert(current_mi_row != -1 &&
           current_mi_row < this_tile->tile_info.mi_row_end);

    const int unit_height_log2 = mi_size_high_log2[fp_block_size];
    av1_first_pass_row(cpi, td, this_tile, current_mi_row >> unit_height_log2,
                       fp_block_size);
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
#endif
    row_mt_sync->num_threads_working--;
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
  }
  error_info->setjmp = 0;
  return 1;
}